

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::Type> * __thiscall
capnp::compiler::Compiler::Node::resolveBootstrapType
          (Maybe<capnp::Type> *__return_storage_ptr__,Node *this,Reader type,Schema scope)

{
  int iVar1;
  Exception *in_RCX;
  char *pcVar2;
  Type TVar3;
  StringPtr error;
  NullableValue<kj::Exception> _exception986;
  NullableValue<kj::Exception> local_4d0;
  NullableValue<kj::Exception> local_338;
  
  (__return_storage_ptr__->ptr).isSet = false;
  TVar3 = SchemaLoader::getType(&(this->module->compiler->workspace).bootstrapLoader,type,scope);
  (__return_storage_ptr__->ptr).field_1.value = TVar3;
  (__return_storage_ptr__->ptr).isSet = true;
  local_4d0.isSet = false;
  kj::_::NullableValue<kj::Exception>::NullableValue(&local_338,&local_4d0);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_4d0);
  if (local_338.isSet == true) {
    if ((__return_storage_ptr__->ptr).isSet == true) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    iVar1 = (*(this->module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[1])();
    if ((char)iVar1 == '\0') {
      kj::str<char_const(&)[57],kj::Exception&>
                ((String *)&local_4d0,
                 (kj *)"Internal compiler bug: Bootstrap schema failed to load:\n",
                 (char (*) [57])&local_338.field_1,in_RCX);
      if (local_4d0.field_1.value.ownFile.content.ptr == (char *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (char *)CONCAT71(local_4d0._1_7_,local_4d0.isSet);
      }
      error.content.size_ =
           local_4d0.field_1.value.ownFile.content.ptr +
           (local_4d0.field_1.value.ownFile.content.ptr == (char *)0x0);
      error.content.ptr = pcVar2;
      addError(this,error);
      kj::Array<char>::~Array((Array<char> *)&local_4d0);
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_338);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Type> Compiler::Node::resolveBootstrapType(schema::Type::Reader type, Schema scope) {
  // TODO(someday): Arguably should return null if the type or its dependencies are placeholders.

  kj::Maybe<Type> result;
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    result = module->getCompiler().getWorkspace().bootstrapLoader.getType(type, scope);
  })) {
    result = kj::none;
    if (!module->getErrorReporter().hadErrors()) {
      addError(kj::str("Internal compiler bug: Bootstrap schema failed to load:\n",
                       exception));
    }
  }
  return result;
}